

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_NoiseModelUpdateTest_::
UpdateFailsNoFlatBlocks<BitDepthParams<unsigned_short,_12,_true>_>::~UpdateFailsNoFlatBlocks
          (UpdateFailsNoFlatBlocks<BitDepthParams<unsigned_short,_12,_true>_> *this)

{
  void *in_RDI;
  
  ~UpdateFailsNoFlatBlocks
            ((UpdateFailsNoFlatBlocks<BitDepthParams<unsigned_short,_12,_true>_> *)0x5c35d8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TYPED_TEST_P(NoiseModelUpdateTest, UpdateFailsNoFlatBlocks) {
  EXPECT_EQ(AOM_NOISE_STATUS_INSUFFICIENT_FLAT_BLOCKS,
            this->NoiseModelUpdate());
}